

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::iterate
          (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this)

{
  ostringstream *poVar1;
  float *pfVar2;
  pointer p_Var3;
  pointer p_Var4;
  pointer p_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  TestError *this_00;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  pointer p_Var18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  GLint shader_id_te;
  GLint shader_id_tc;
  GLint shader_type_te;
  GLint shader_type_tc;
  GLuint local_1d4;
  GLuint local_1d0;
  GLenum local_1cc;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar11;
  
  initTest(this);
  if (this->m_gl_max_patch_vertices_value < 1) {
    uVar14 = 0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    uVar15 = 0;
    uVar16 = 0;
    iVar17 = 0;
    fVar22 = 0.0;
    fVar21 = 0.0;
    fVar27 = 0.0;
  }
  else {
    fVar27 = 0.0;
    iVar9 = 0;
    iVar12 = 3;
    fVar21 = 0.0;
    fVar22 = 0.0;
    iVar17 = 0;
    uVar16 = 0;
    uVar15 = 0;
    uVar14 = 0;
    fVar26 = 0.0;
    fVar25 = 0.0;
    fVar24 = 0.0;
    fVar23 = 0.0;
    do {
      iVar13 = iVar9 + 2;
      iVar17 = iVar17 + iVar9 + 1;
      uVar16 = (ulong)(uint)(iVar9 + 2 + (int)uVar16);
      uVar15 = (ulong)(uint)((int)uVar15 + 3 + iVar9);
      uVar14 = (ulong)(uint)((int)uVar14 + 4 + iVar9);
      iVar9 = iVar9 + 1;
      fVar24 = fVar24 + (float)(iVar12 + -3);
      fVar23 = fVar23 + (float)(iVar12 + -2);
      fVar22 = fVar22 + (float)(iVar12 + -1);
      fVar21 = fVar21 + (float)iVar12;
      fVar27 = fVar27 + 1.0 / (float)iVar9;
      fVar26 = fVar26 + 1.0 / (float)iVar9;
      fVar25 = fVar25 + 1.0 / (float)iVar13;
      iVar12 = iVar12 + 4;
    } while (this->m_gl_max_patch_vertices_value != iVar9);
  }
  p_Var18 = (this->m_runs).
            super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = uVar16;
  uVar7 = uVar15;
  uVar8 = uVar14;
  if (p_Var18 !=
      (this->m_runs).
      super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_1b8 = uVar8;
      local_1c0 = uVar7;
      local_1c8 = uVar6;
      if (p_Var18 ==
          (this->m_runs).
          super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar9 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        lVar11 = CONCAT44(extraout_var,iVar9);
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
        local_1cc = 0;
        (**(code **)(lVar11 + 0xa70))(p_Var18->tc_id,0x8b4f,local_1b0);
        (**(code **)(lVar11 + 0xa70))(p_Var18->te_id,0x8b4f,&local_1cc);
        dVar10 = (**(code **)(lVar11 + 0x800))();
        glu::checkError(dVar10,"glGetShaderiv() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xbc4);
        if (local_1b0._0_4_ != (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "Invalid shader type reported by glGetShaderiv() for a tessellation control shader"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xbc8);
          goto LAB_00d44a69;
        }
        if (local_1cc != (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "Invalid shader type reported by glGetShaderiv() for a tessellation evaluation shader"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xbcd);
          goto LAB_00d44a69;
        }
        local_1d0 = 0;
        local_1d4 = 0;
        (**(code **)(lVar11 + 0x9a0))
                  (p_Var18->pipeline_object_id,local_1b0._0_8_ & 0xffffffff,&local_1d0);
        (**(code **)(lVar11 + 0x9a0))
                  (p_Var18->pipeline_object_id,
                   (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER,&local_1d4);
        dVar10 = (**(code **)(lVar11 + 0x800))();
        glu::checkError(dVar10,
                        "glGetProgramPipelineiv() failed for GL_TESS_CONTROL_SHADER_EXT / GL_TESS_EVALUATION_SHADER_EXT enum(s)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xbd8);
        if (local_1d0 != p_Var18->tc_program_id) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "Invalid separate program object ID reported for Tessellation Control stage",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xbdc);
          goto LAB_00d44a69;
        }
        uVar14 = local_1b8;
        uVar15 = local_1c0;
        uVar16 = local_1c8;
        if (local_1d4 != p_Var18->te_program_id) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "Invalid separate program object ID reported for Tessellation Evaluation stage"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xbe1);
          goto LAB_00d44a69;
        }
      }
      if (p_Var18->point_mode == true) {
        pfVar2 = (p_Var18->result_pointsize_data).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((long)(p_Var18->result_pointsize_data).super__Vector_base<float,_std::allocator<float>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2 == 4) {
          fVar19 = *pfVar2 - fVar27;
          fVar20 = -fVar19;
          if (-fVar19 <= fVar19) {
            fVar20 = fVar19;
          }
          if (fVar20 <= 1e-05) goto LAB_00d442f9;
        }
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Tessellation Evaluation stage set gl_PointSize value to ",0x38
                  );
        std::ostream::_M_insert<double>
                  ((double)*(p_Var18->result_pointsize_data).
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," instead of expected value ",0x1b);
        std::ostream::_M_insert<double>((double)fVar27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid gl_PointSize data exposed in TE stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbef);
        goto LAB_00d44a69;
      }
LAB_00d442f9:
      p_Var3 = (p_Var18->result_position_data).
               super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((((long)(p_Var18->result_position_data).
                   super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)p_Var3 != 0x10) ||
           (p_Var3->x != fVar24)) || (NAN(p_Var3->x) || NAN(fVar24))) ||
         ((((p_Var3->y != fVar23 || (NAN(p_Var3->y) || NAN(fVar23))) ||
           ((p_Var3->z != fVar22 || ((NAN(p_Var3->z) || NAN(fVar22) || (p_Var3->w != fVar21)))))) ||
          (NAN(p_Var3->w) || NAN(fVar21))))) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Tessellation Evaluation stage set gl_Position to ",0x31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        std::ostream::_M_insert<double>
                  ((double)((p_Var18->result_position_data).
                            super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                            super__Vector_impl_data._M_start)->x);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>
                  ((double)((p_Var18->result_position_data).
                            super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                            super__Vector_impl_data._M_start)->y);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>
                  ((double)((p_Var18->result_position_data).
                            super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                            super__Vector_impl_data._M_start)->z);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>
                  ((double)((p_Var18->result_position_data).
                            super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                            super__Vector_impl_data._M_start)->w);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," ) instead of expected value (",0x1e);
        std::ostream::_M_insert<double>((double)fVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar22);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid gl_Position data exposed in TE stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xc00);
        goto LAB_00d44a69;
      }
      p_Var4 = (p_Var18->result_value1_data).
               super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(p_Var18->result_value1_data).
                super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)p_Var4 != 8) {
LAB_00d447b5:
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Tessellation Evaluation stage set te_value1 to ",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        std::ostream::_M_insert<double>
                  ((double)((p_Var18->result_value1_data).
                            super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>._M_impl.
                            super__Vector_impl_data._M_start)->x);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>
                  ((double)((p_Var18->result_value1_data).
                            super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>._M_impl.
                            super__Vector_impl_data._M_start)->y);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," ) instead of expected value (",0x1e);
        std::ostream::_M_insert<double>((double)fVar26);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid gl_Position data exposed in TE stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xc11);
LAB_00d44a69:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      fVar19 = p_Var4->x - fVar26;
      fVar20 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar20 = fVar19;
      }
      if (1e-05 < fVar20) goto LAB_00d447b5;
      fVar19 = p_Var4->y - fVar25;
      fVar20 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar20 = fVar19;
      }
      if (1e-05 < fVar20) goto LAB_00d447b5;
      p_Var5 = (p_Var18->result_value2_data).
               super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((((long)(p_Var18->result_value2_data).
                   super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)p_Var5 != 0x10) ||
           (p_Var5->x != iVar17)) || (p_Var5->y != (int)uVar16)) ||
         ((p_Var5->z != (int)uVar15 || (p_Var5->w != (int)uVar14)))) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Tessellation Evaluation stage set te_value2 to ",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        std::ostream::operator<<
                  (poVar1,((p_Var18->result_value2_data).
                           super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl
                           .super__Vector_impl_data._M_start)->x);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<
                  (poVar1,((p_Var18->result_value2_data).
                           super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl
                           .super__Vector_impl_data._M_start)->y);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<
                  (poVar1,((p_Var18->result_value2_data).
                           super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl
                           .super__Vector_impl_data._M_start)->z);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<
                  (poVar1,((p_Var18->result_value2_data).
                           super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl
                           .super__Vector_impl_data._M_start)->w);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," ) instead of expected value (",0x1e);
        std::ostream::operator<<(poVar1,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(int)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(int)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(int)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid value2 data saved in TE stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xc22);
        goto LAB_00d44a69;
      }
      p_Var18 = p_Var18 + 1;
      uVar6 = local_1c8;
      uVar7 = local_1c0;
      uVar8 = local_1b8;
    } while (p_Var18 !=
             (this->m_runs).
             super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::iterate(void)
{
	/* Initialize ES test objects */
	initTest();

	/* Calculate reference values that should be generated for all runs */
	float		reference_result_pointsize(0);
	_vec4		reference_result_position(0, 0, 0, 0);
	_vec2		reference_result_value1(0, 0);
	_ivec4		reference_result_value2(0, 0, 0, 0);
	const float epsilon = (float)1e-5;

	for (glw::GLint n_invocation = 0; n_invocation < m_gl_max_patch_vertices_value; ++n_invocation)
	{
		/* As per TC and TE shaders */
		reference_result_pointsize += 1.0f / static_cast<float>(n_invocation + 1);

		reference_result_position.x += static_cast<float>(n_invocation * 4 + 0);
		reference_result_position.y += static_cast<float>(n_invocation * 4 + 1);
		reference_result_position.z += static_cast<float>(n_invocation * 4 + 2);
		reference_result_position.w += static_cast<float>(n_invocation * 4 + 3);

		reference_result_value1.x += 1.0f / static_cast<float>(n_invocation + 1);
		reference_result_value1.y += 1.0f / static_cast<float>(n_invocation + 2);

		reference_result_value2.x += (n_invocation + 1);
		reference_result_value2.y += (n_invocation + 2);
		reference_result_value2.z += (n_invocation + 3);
		reference_result_value2.w += (n_invocation + 4);
	}

	/* Iterate through test runs and analyse the result data */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* For the very first run, make sure that the type of tessellation shader objects
		 * is reported correctly for both program and pipeline object cases.
		 */
		if (run_iterator == m_runs.begin())
		{
			const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
			glw::GLint			  shader_type_tc = GL_NONE;
			glw::GLint			  shader_type_te = GL_NONE;

			/* Program objects first */
			gl.getShaderiv(run.tc_id, GL_SHADER_TYPE, &shader_type_tc);
			gl.getShaderiv(run.te_id, GL_SHADER_TYPE, &shader_type_te);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call(s) failed");

			if ((glw::GLenum)shader_type_tc != m_glExtTokens.TESS_CONTROL_SHADER)
			{
				TCU_FAIL("Invalid shader type reported by glGetShaderiv() for a tessellation control shader");
			}

			if ((glw::GLenum)shader_type_te != m_glExtTokens.TESS_EVALUATION_SHADER)
			{
				TCU_FAIL("Invalid shader type reported by glGetShaderiv() for a tessellation evaluation shader");
			}

			/* Let's query the pipeline object now */
			glw::GLint shader_id_tc = 0;
			glw::GLint shader_id_te = 0;

			gl.getProgramPipelineiv(run.pipeline_object_id, m_glExtTokens.TESS_CONTROL_SHADER, &shader_id_tc);
			gl.getProgramPipelineiv(run.pipeline_object_id, m_glExtTokens.TESS_EVALUATION_SHADER, &shader_id_te);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() failed for GL_TESS_CONTROL_SHADER_EXT / "
											   "GL_TESS_EVALUATION_SHADER_EXT enum(s)");

			if ((glw::GLuint)shader_id_tc != run.tc_program_id)
			{
				TCU_FAIL("Invalid separate program object ID reported for Tessellation Control stage");
			}

			if ((glw::GLuint)shader_id_te != run.te_program_id)
			{
				TCU_FAIL("Invalid separate program object ID reported for Tessellation Evaluation stage");
			}
		}

		if ((run.point_mode && run.result_pointsize_data.size() != 1) ||
			(run.point_mode && de::abs(run.result_pointsize_data[0] - reference_result_pointsize) > epsilon))
		{
			/* It is a test bug if result_pointsize_data.size() == 0 */
			DE_ASSERT(run.result_pointsize_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set gl_PointSize value to "
							   << run.result_pointsize_data[0] << " instead of expected value "
							   << reference_result_pointsize << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_PointSize data exposed in TE stage");
		}

		if (run.result_position_data.size() != 1 || run.result_position_data[0] != reference_result_position)
		{
			/* It is a test bug if result_position_data.size() == 0 */
			DE_ASSERT(run.result_position_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set gl_Position to "
							   << " (" << run.result_position_data[0].x << ", " << run.result_position_data[0].y << ", "
							   << run.result_position_data[0].z << ", " << run.result_position_data[0].w
							   << " ) instead of expected value"
								  " ("
							   << reference_result_position.x << ", " << reference_result_position.y << ", "
							   << reference_result_position.z << ", " << reference_result_position.w << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_Position data exposed in TE stage");
		}

		if (run.result_value1_data.size() != 1 ||
			de::abs(run.result_value1_data[0].x - reference_result_value1.x) > epsilon ||
			de::abs(run.result_value1_data[0].y - reference_result_value1.y) > epsilon)
		{
			/* It is a test bug if result_value1_data.size() == 0 */
			DE_ASSERT(run.result_value1_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set te_value1 to "
							   << " (" << run.result_value1_data[0].x << ", " << run.result_value1_data[0].y
							   << " ) instead of expected value"
								  " ("
							   << reference_result_value1.x << ", " << reference_result_value1.y << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_Position data exposed in TE stage");
		}

		if (run.result_value2_data.size() != 1 || run.result_value2_data[0] != reference_result_value2)
		{
			/* It is a test bug if result_value2_data.size() == 0 */
			DE_ASSERT(run.result_value2_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set te_value2 to "
							   << " (" << run.result_value2_data[0].x << ", " << run.result_value2_data[0].y << ", "
							   << run.result_value2_data[0].z << ", " << run.result_value2_data[0].w
							   << " ) instead of expected value"
								  " ("
							   << reference_result_value2.x << ", " << reference_result_value2.y << ", "
							   << reference_result_value2.z << ", " << reference_result_value2.w << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value2 data saved in TE stage");
		}
	} /* for (all runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}